

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::IsRFC6145(CNetAddr *this)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  char local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV6) {
    local_18[0] = '\0';
    local_18[1] = '\0';
    local_18[2] = '\0';
    local_18[3] = '\0';
    local_18[4] = '\0';
    local_18[5] = '\0';
    local_18[6] = '\0';
    local_18[7] = '\0';
    local_18[8] = -1;
    local_18[9] = -1;
    local_18[10] = '\0';
    local_18[0xb] = '\0';
    uVar3 = (this->m_addr)._size;
    uVar4 = uVar3 - 0x11;
    if (uVar3 < 0x11) {
      uVar4 = uVar3;
    }
    if (0xb < uVar4) {
      if (0x10 < uVar3) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      if ((this->m_addr)._union.direct[0] == '\0') {
        lVar5 = 1;
        do {
          bVar6 = lVar5 == 0xc;
          if (bVar6) goto LAB_00d6e5c8;
          pcVar1 = local_18 + lVar5;
          pcVar2 = (this->m_addr)._union.direct + lVar5;
          lVar5 = lVar5 + 1;
        } while (*pcVar1 == *pcVar2);
      }
    }
  }
  bVar6 = false;
LAB_00d6e5c8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC6145() const
{
    return IsIPv6() &&
           HasPrefix(m_addr, std::array<uint8_t, 12>{0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                                     0x00, 0x00, 0xFF, 0xFF, 0x00, 0x00});
}